

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall
FIX::Session::generateResendRequest(Session *this,BeginString *beginString,MsgSeqNum *msgSeqNum)

{
  string *psVar1;
  string *psVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Message *message;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  signed_int value;
  signed_int value_00;
  ulong uVar10;
  undefined8 uVar11;
  string *psVar12;
  EndSeqNo endSeqNo;
  BeginSeqNo beginSeqNo;
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  long lStack_1c0;
  string local_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  char local_178 [16];
  _Alloc_hider local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  size_t local_148;
  int local_140;
  IntField *local_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string local_110;
  undefined1 local_f0 [48];
  _Alloc_hider local_c0;
  size_type local_b8;
  size_t local_a0;
  int local_98;
  undefined1 local_90 [96];
  
  local_90._0_8_ = local_90 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"2","");
  message = newMessage(this,(string *)local_90);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  iVar3 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
  IntField::IntField((IntField *)local_90,7,iVar3);
  local_90._0_8_ = &PTR__FieldBase_001ec048;
  iVar3 = IntField::getValue(&msgSeqNum->super_SeqNumField);
  IntField::IntField((IntField *)local_f0,0x10,iVar3 + -1);
  local_f0._0_8_ = &PTR__FieldBase_001ec080;
  psVar12 = &(beginString->super_StringField).super_FieldBase.m_string;
  iVar3 = std::__cxx11::string::compare((char *)psVar12);
  if (iVar3 < 0) {
    iVar3 = std::__cxx11::string::compare((char *)psVar12);
    if (iVar3 < 1) {
      IntField::IntField((IntField *)local_198,0x10,999999);
      local_198._0_8_ = &PTR__FieldBase_001ec080;
      local_f0._8_4_ = local_198._8_4_;
      std::__cxx11::string::_M_assign((string *)(local_f0 + 0x10));
      goto LAB_001a1e28;
    }
  }
  else {
    IntField::IntField((IntField *)local_198,0x10,0);
    local_198._0_8_ = &PTR__FieldBase_001ec080;
    local_f0._8_4_ = local_198._8_4_;
    std::__cxx11::string::_M_assign((string *)(local_f0 + 0x10));
LAB_001a1e28:
    local_98 = local_140;
    local_a0 = local_148;
    local_b8 = 0;
    *local_c0._M_p = '\0';
    FieldBase::~FieldBase((FieldBase *)local_198);
  }
  local_1d8 = &local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"2","");
  psVar2 = (string *)(local_198 + 0x10);
  local_198._0_8_ = &PTR__FieldBase_001ea6e0;
  local_198._8_4_ = 0x23;
  local_188._M_allocated_capacity = (size_type)local_178;
  local_138 = &msgSeqNum->super_SeqNumField;
  std::__cxx11::string::_M_construct<char*>(psVar2,local_1d8,local_1d0 + (long)local_1d8);
  local_168._M_p = (pointer)&local_158;
  local_160 = 0;
  local_158._M_local_buf[0] = '\0';
  local_148 = 0;
  local_140 = 0;
  local_198._0_8_ = &PTR__FieldBase_001ea860;
  FieldMap::setField(&(message->m_header).super_FieldMap,(FieldBase *)local_198,true);
  FieldBase::~FieldBase((FieldBase *)local_198);
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,local_1c8 + 1);
  }
  FieldMap::setField(&message->super_FieldMap,(FieldBase *)local_90,true);
  FieldMap::setField(&message->super_FieldMap,(FieldBase *)local_f0,true);
  fill(this,&message->m_header);
  sendRaw(this,message,0);
  uVar4 = IntField::getValue((IntField *)local_90);
  IntConvertor::convert_abi_cxx11_(&local_110,(IntConvertor *)(ulong)uVar4,value);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x1c4cf4);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_120 = *plVar8;
    lStack_118 = plVar6[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar8;
    local_130 = (long *)*plVar6;
  }
  local_128 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_130);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_1c8 = *puVar9;
    lStack_1c0 = plVar6[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *puVar9;
    local_1d8 = (ulong *)*plVar6;
  }
  local_1d0 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar4 = IntField::getValue((IntField *)local_f0);
  IntConvertor::convert_abi_cxx11_(&local_1b8,(IntConvertor *)(ulong)uVar4,value_00);
  uVar10 = 0xf;
  if (local_1d8 != &local_1c8) {
    uVar10 = local_1c8;
  }
  if (uVar10 < local_1b8._M_string_length + local_1d0) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      uVar11 = local_1b8.field_2._M_allocated_capacity;
    }
    if (local_1b8._M_string_length + local_1d0 <= (ulong)uVar11) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_1d8);
      goto LAB_001a20d3;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b8._M_dataplus._M_p);
LAB_001a20d3:
  psVar1 = (string *)(puVar7 + 2);
  if ((string *)*puVar7 == psVar1) {
    local_188._M_allocated_capacity = *(undefined8 *)psVar1;
    local_188._8_8_ = puVar7[3];
    local_198._0_8_ = psVar2;
  }
  else {
    local_188._M_allocated_capacity = *(undefined8 *)psVar1;
    local_198._0_8_ = (string *)*puVar7;
  }
  local_198._8_8_ = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *psVar1 = (string)0x0;
  SessionState::onEvent(&this->m_state,(string *)local_198);
  if ((string *)local_198._0_8_ != psVar2) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_188._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,local_1c8 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  iVar3 = IntField::getValue((IntField *)local_90);
  iVar5 = IntField::getValue(local_138);
  (this->m_state).m_resendRange.first = iVar3;
  (this->m_state).m_resendRange.second = iVar5 + -1;
  FieldBase::~FieldBase((FieldBase *)local_f0);
  FieldBase::~FieldBase((FieldBase *)local_90);
  (*(message->super_FieldMap)._vptr_FieldMap[1])(message);
  return;
}

Assistant:

void Session::generateResendRequest( const BeginString& beginString, const MsgSeqNum& msgSeqNum )
{
  SmartPtr<Message> pMsg(newMessage("2"));
  Message & resendRequest = *pMsg;

  BeginSeqNo beginSeqNo( ( int ) getExpectedTargetNum() );
  EndSeqNo endSeqNo( msgSeqNum - 1 );
  if ( beginString >= FIX::BeginString_FIX42 )
    endSeqNo = 0;
  else if( beginString <= FIX::BeginString_FIX41 )
    endSeqNo = 999999;
  resendRequest.getHeader().setField( MsgType( "2" ) );
  resendRequest.setField( beginSeqNo );
  resendRequest.setField( endSeqNo );
  fill( resendRequest.getHeader() );
  sendRaw( resendRequest );

  m_state.onEvent( "Sent ResendRequest FROM: "
                   + IntConvertor::convert( beginSeqNo ) +
                   " TO: " + IntConvertor::convert( endSeqNo ) );

  m_state.resendRange( beginSeqNo, msgSeqNum - 1 );
}